

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.cpp
# Opt level: O3

Error * __thiscall
Worker::parse_and_validate_json_request(Error *__return_storage_ptr__,Worker *this,string *request)

{
  pointer *pppTVar1;
  iterator __position;
  bool bVar2;
  Type this_00;
  ValueIterator pGVar3;
  Task *this_01;
  char *pcVar4;
  ValueType *json_task;
  Value *value;
  Task *task;
  Document document;
  undefined1 local_b8 [32];
  vector<libsbox::Task*,std::allocator<libsbox::Task*>> *local_98;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  local_90;
  
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument(&local_90,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  local_b8._0_8_ = (request->_M_dataplus)._M_p;
  local_b8._8_8_ = local_b8._0_8_;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
  ::ParseStream<0u,rapidjson::UTF8<char>,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
            ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
              *)&local_90,(GenericStringStream<rapidjson::UTF8<char>_> *)local_b8);
  if ((long)(int)local_90.parseResult_.code_ == 0) {
    bVar2 = SchemaValidator::validate
                      ((this->request_validator_)._M_t.
                       super___uniq_ptr_impl<SchemaValidator,_std::default_delete<SchemaValidator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_SchemaValidator_*,_std::default_delete<SchemaValidator>_>
                       .super__Head_base<0UL,_SchemaValidator_*,_false>._M_head_impl,&local_90);
    if (bVar2) {
      if ((this->tasks_).super__Vector_base<libsbox::Task_*,_std::allocator<libsbox::Task_*>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (this->tasks_).super__Vector_base<libsbox::Task_*,_std::allocator<libsbox::Task_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        __assert_fail("tasks_.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/src/worker.cpp"
                      ,0xa8,"Error Worker::parse_and_validate_json_request(const std::string &)");
      }
      this_00 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ::operator[]<char_const>
                          ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            *)&local_90,"tasks");
      if ((this_00->data_).f.flags != 4) {
        __assert_fail("IsArray()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                      ,0x711,
                      "Array rapidjson::GenericValue<rapidjson::UTF8<>>::GetArray() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                     );
      }
      value = (Value *)((ulong)(this_00->data_).s.str & 0xffffffffffff);
      pGVar3 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::End(this_00);
      if (pGVar3 != value) {
        local_98 = (vector<libsbox::Task*,std::allocator<libsbox::Task*>> *)&this->tasks_;
        do {
          this_01 = (Task *)operator_new(0x118);
          memset(&this_01->max_files_,0,0xf8);
          *(undefined4 *)&this_01->time_limit_ms_ = 0xffffffff;
          *(undefined4 *)((long)&this_01->time_limit_ms_ + 4) = 0xffffffff;
          *(undefined4 *)&this_01->wall_time_limit_ms_ = 0xffffffff;
          *(undefined4 *)((long)&this_01->wall_time_limit_ms_ + 4) = 0xffffffff;
          *(undefined4 *)&this_01->memory_limit_kb_ = 0xffffffff;
          *(undefined4 *)((long)&this_01->memory_limit_kb_ + 4) = 0xffffffff;
          *(undefined4 *)&this_01->fsize_limit_kb_ = 0xffffffff;
          *(undefined4 *)((long)&this_01->fsize_limit_kb_ + 4) = 0xffffffff;
          this_01->max_files_ = 0x10;
          this_01->max_threads_ = 1;
          this_01->use_standard_binds_ = true;
          (this_01->stdin_).filename_._M_dataplus._M_p =
               (pointer)&(this_01->stdin_).filename_.field_2;
          (this_01->stdin_).filename_.field_2._M_local_buf[0] = '\0';
          (this_01->stdout_).filename_._M_dataplus._M_p =
               (pointer)&(this_01->stdout_).filename_.field_2;
          (this_01->stdout_).filename_.field_2._M_local_buf[0] = '\0';
          (this_01->stderr_).super_Stream.filename_._M_dataplus._M_p =
               (pointer)&(this_01->stderr_).super_Stream.filename_.field_2;
          (this_01->stderr_).super_Stream.filename_.field_2._M_local_buf[0] = '\0';
          (this_01->argv_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (this_01->argv_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          *(undefined1 (*) [16])
           &(this_01->argv_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
          (this_01->env_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (this_01->env_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (this_01->binds_).
          super__Vector_base<libsbox::BindRule,_std::allocator<libsbox::BindRule>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (this_01->binds_).
          super__Vector_base<libsbox::BindRule,_std::allocator<libsbox::BindRule>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          *(undefined1 (*) [16])
           &(this_01->binds_).
            super__Vector_base<libsbox::BindRule,_std::allocator<libsbox::BindRule>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
          this_01->time_usage_sys_ms_ = 0;
          this_01->time_usage_user_ms_ = 0;
          this_01->wall_time_usage_ms_ = 0;
          this_01->memory_usage_kb_ = 0;
          *(undefined4 *)((long)&this_01->memory_usage_kb_ + 7) = 0;
          this_01->exit_code_ = -1;
          this_01->term_signal_ = -1;
          this_01->memory_limit_hit_ = false;
          local_b8._0_8_ = this_01;
          libsbox::Task::
          deserialize_request<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                    (this_01,value);
          __position._M_current =
               (this->tasks_).super__Vector_base<libsbox::Task_*,_std::allocator<libsbox::Task_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->tasks_).super__Vector_base<libsbox::Task_*,_std::allocator<libsbox::Task_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<libsbox::Task*,std::allocator<libsbox::Task*>>::
            _M_realloc_insert<libsbox::Task*const&>(local_98,__position,(Task **)local_b8);
          }
          else {
            *__position._M_current = (Task *)local_b8._0_8_;
            pppTVar1 = &(this->tasks_).
                        super__Vector_base<libsbox::Task_*,_std::allocator<libsbox::Task_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            *pppTVar1 = *pppTVar1 + 1;
          }
          value = value + 1;
        } while (value != pGVar3);
      }
      (__return_storage_ptr__->error_).field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )0x0;
      (__return_storage_ptr__->error_)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->error_).field_2;
      (__return_storage_ptr__->error_)._M_string_length = 0;
      goto LAB_00115af7;
    }
    SchemaValidator::get_error_abi_cxx11_
              ((string *)local_b8,
               (this->request_validator_)._M_t.
               super___uniq_ptr_impl<SchemaValidator,_std::default_delete<SchemaValidator>_>._M_t.
               super__Tuple_impl<0UL,_SchemaValidator_*,_std::default_delete<SchemaValidator>_>.
               super__Head_base<0UL,_SchemaValidator_*,_false>._M_head_impl);
    Error::Error(__return_storage_ptr__,(string *)local_b8);
  }
  else {
    if (local_90.parseResult_.code_ < (kParseErrorTermination|kParseErrorDocumentRootNotSingular)) {
      pcVar4 = &DAT_001360d0 + *(int *)("6Worker" + (long)(int)local_90.parseResult_.code_ * 4 + 4);
    }
    else {
      pcVar4 = "Unknown error.";
    }
    format_abi_cxx11_((string *)local_b8,"Request JSON incorrect: %s (at %zi)",pcVar4,
                      local_90.parseResult_.offset_);
    Error::Error(__return_storage_ptr__,(string *)local_b8);
  }
  if ((Task *)local_b8._0_8_ != (Task *)(local_b8 + 0x10)) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
  }
LAB_00115af7:
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument(&local_90);
  return __return_storage_ptr__;
}

Assistant:

Error Worker::parse_and_validate_json_request(const std::string &request) {
    rapidjson::Document document;
    document.Parse(request.c_str());

    if (document.HasParseError()) {
        return Error(format(
            "Request JSON incorrect: %s (at %zi)",
            GetParseError_En(document.GetParseError()),
            document.GetErrorOffset()
        ));
    }

    if (!request_validator_->validate(document)) {
        return Error(request_validator_->get_error());
    }

    assert(tasks_.empty());

    for (const auto &json_task : document["tasks"].GetArray()) {
        libsbox::Task *task = new libsbox::Task();
        task->deserialize_request(json_task);
        tasks_.push_back(task);
    }

    return Error();
}